

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameMaster.cpp
# Opt level: O0

Task __thiscall GameMaster::run(GameMaster *this,Task mode)

{
  Task mode_local;
  GameMaster *this_local;
  
  switch(mode) {
  case Init:
    this_local._4_4_ = task_init(this);
    break;
  case Op:
    this_local._4_4_ = task_op(this);
    break;
  case Set:
    this_local._4_4_ = task_set(this);
    break;
  case Insert:
    this_local._4_4_ = task_insert(this);
    break;
  case Revert:
    this_local._4_4_ = task_revert(this);
    break;
  case Write:
    this_local._4_4_ = task_write(this);
    break;
  case Judge:
    this_local._4_4_ = task_judge(this);
    break;
  case Switch:
    this_local._4_4_ = task_switch(this);
    break;
  case Ask:
    this_local._4_4_ = task_ask(this);
    break;
  case Ed:
  default:
    this_local._4_4_ = Ed;
  }
  return this_local._4_4_;
}

Assistant:

GameMaster::Task GameMaster::run(Task mode)
{
  switch (mode) {
  case Task::Init:   return task_init();
  case Task::Op:     return task_op();
  case Task::Set:    return task_set();
  case Task::Insert: return task_insert();
  case Task::Revert: return task_revert();
  case Task::Write:  return task_write();
  case Task::Judge:  return task_judge();
  case Task::Switch: return task_switch();
  case Task::Ask:    return task_ask();
  case Task::Ed:
  default:           return Task::Ed;
  }
}